

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# per_support.c
# Opt level: O0

ssize_t uper_get_length(asn_per_data_t *pd,int ebits,int *repeat)

{
  int32_t iVar1;
  undefined4 *in_RDX;
  int in_ESI;
  ssize_t value;
  int in_stack_0000006c;
  asn_per_data_t *in_stack_00000070;
  ulong local_8;
  
  *in_RDX = 0;
  if (in_ESI < 0) {
    iVar1 = per_get_few_bits(in_stack_00000070,in_stack_0000006c);
    local_8 = (ulong)iVar1;
    if ((long)local_8 < 0) {
      local_8 = 0xffffffffffffffff;
    }
    else if ((local_8 & 0x80) == 0) {
      local_8 = local_8 & 0x7f;
    }
    else if ((local_8 & 0x40) == 0) {
      iVar1 = per_get_few_bits(in_stack_00000070,in_stack_0000006c);
      local_8 = (local_8 & 0x3f) << 8 | (long)iVar1;
      if ((long)local_8 < 0) {
        local_8 = 0xffffffffffffffff;
      }
    }
    else {
      local_8 = local_8 & 0x3f;
      if ((local_8 == 0) || (4 < local_8)) {
        local_8 = 0xffffffffffffffff;
      }
      else {
        *in_RDX = 1;
        local_8 = local_8 << 0xe;
      }
    }
  }
  else {
    iVar1 = per_get_few_bits(in_stack_00000070,in_stack_0000006c);
    local_8 = (ulong)iVar1;
  }
  return local_8;
}

Assistant:

ssize_t
uper_get_length(asn_per_data_t *pd, int ebits, int *repeat) {
	ssize_t value;

	*repeat = 0;

	if(ebits >= 0) return per_get_few_bits(pd, ebits);

	value = per_get_few_bits(pd, 8);
	if(value < 0) return -1;
	if((value & 128) == 0)	/* #10.9.3.6 */
		return (value & 0x7F);
	if((value & 64) == 0) {	/* #10.9.3.7 */
		value = ((value & 63) << 8) | per_get_few_bits(pd, 8);
		if(value < 0) return -1;
		return value;
	}
	value &= 63;	/* this is "m" from X.691, #10.9.3.8 */
	if(value < 1 || value > 4)
		return -1;
	*repeat = 1;
	return (16384 * value);
}